

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O0

Result * __thiscall
CoreML::LinearModel::setWeights
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *weights)

{
  bool bVar1;
  element_type *this_00;
  GLMRegressor *this_01;
  reference __x;
  GLMRegressor_DoubleArray *this_02;
  reference pdVar2;
  double n;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  DoubleArray *cur_arr;
  vector<double,_std::allocator<double>_> w;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  GLMRegressor *lr;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *weights_local;
  LinearModel *this_local;
  
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_glmregressor(this_00);
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(weights);
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::end(weights);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)&w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
          ::operator*(&__end1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&cur_arr,__x);
    this_02 = Specification::GLMRegressor::add_weights(this_01);
    __end2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)&cur_arr);
    n = (double)std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)&cur_arr);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)&n);
      if (!bVar1) break;
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&__end2);
      Specification::GLMRegressor_DoubleArray::add_value(this_02,*pdVar2);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end2);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&cur_arr);
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result LinearModel::setWeights(std::vector< std::vector<double>> weights) {
        auto lr = m_spec->mutable_glmregressor();
        for(auto w : weights) {
            Specification::GLMRegressor::DoubleArray* cur_arr = lr->add_weights();
            for(double n : w) {
                cur_arr->add_value(n);
            }
        }
        return Result();
    }